

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O0

MPP_RET __thiscall Mpp::enqueue(Mpp *this,MppPortType type,MppTask task)

{
  RK_U32 local_3c;
  MppPort pvStack_38;
  RK_U32 notify_flag;
  MppTaskQueue port;
  MPP_RET ret;
  MppTask task_local;
  MppPortType type_local;
  Mpp *this_local;
  
  if (this->mInitDone == 0) {
    this_local._4_4_ = MPP_ERR_INIT;
  }
  else {
    port._4_4_ = MPP_NOK;
    pvStack_38 = (MppPort)0x0;
    local_3c = 0;
    set_io_mode(this,MPP_IO_MODE_TASK);
    if (type == MPP_PORT_INPUT) {
      pvStack_38 = this->mUsrInPort;
      local_3c = 1;
    }
    else if (type == MPP_PORT_OUTPUT) {
      pvStack_38 = this->mUsrOutPort;
      local_3c = 8;
    }
    if ((pvStack_38 != (MppPort)0x0) &&
       (port._4_4_ = _mpp_port_enqueue("enqueue",pvStack_38,task), port._4_4_ == MPP_OK)) {
      notify(this,local_3c);
    }
    this_local._4_4_ = port._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

MPP_RET Mpp::enqueue(MppPortType type, MppTask task)
{
    if (!mInitDone)
        return MPP_ERR_INIT;

    MPP_RET ret = MPP_NOK;
    MppTaskQueue port = NULL;
    RK_U32 notify_flag = 0;

    set_io_mode(MPP_IO_MODE_TASK);

    switch (type) {
    case MPP_PORT_INPUT : {
        port = mUsrInPort;
        notify_flag = MPP_INPUT_ENQUEUE;
    } break;
    case MPP_PORT_OUTPUT : {
        port = mUsrOutPort;
        notify_flag = MPP_OUTPUT_ENQUEUE;
    } break;
    default : {
    } break;
    }

    if (port) {
        ret = mpp_port_enqueue(port, task);
        // if enqueue success wait up thread
        if (MPP_OK == ret)
            notify(notify_flag);
    }

    return ret;
}